

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O1

void __thiscall
JointPolicyPureVectorForClusteredBG::RecursivelyFillPolicyForAgent
          (JointPolicyPureVectorForClusteredBG *this,PlanningUnitDecPOMDPDiscrete *pu,
          JPPV_sharedPtr *jpolJPPV,Index agI,Index ts,Index aohI,Index ohI,TypeCluster *tc,Index tI,
          Index aI,vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                   *jpolBGVec,
          vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
          *bgVec)

{
  int *piVar1;
  pointer ppJVar2;
  pointer psVar3;
  sp_counted_base *psVar4;
  MultiAgentDecisionProcessDiscreteInterface *pMVar5;
  BayesianGameWithClusterInfo *this_00;
  Index aohI_00;
  Index ohI_00;
  Index tcI;
  uint aI_00;
  ulong uVar6;
  TypeCluster *tc_00;
  Index oI;
  ulong uVar7;
  Index in_stack_ffffffffffffff58;
  shared_count sStack_60;
  JPPV_sharedPtr local_58;
  JointPolicyPureVectorForClusteredBG *local_40;
  JointPolicyDiscretePure *local_38;
  
  uVar7 = (ulong)ts;
  ppJVar2 = (jpolBGVec->
            super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_40 = this;
  if (uVar7 < (ulong)((long)(jpolBGVec->
                            super__Vector_base<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar2 >> 3)) {
    psVar3 = (bgVec->
             super__Vector_base<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (uVar7 < (ulong)((long)(bgVec->
                              super__Vector_base<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4)) {
      local_38 = ppJVar2[uVar7];
      psVar4 = psVar3[uVar7].pn.pi_;
      this_00 = psVar3[uVar7].px;
      sStack_60.pi_ = psVar3[uVar7].pn.pi_;
      if (psVar4 != (sp_counted_base *)0x0) {
        LOCK();
        piVar1 = &psVar4->use_count_;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      uVar7 = 0;
      while( true ) {
        pMVar5 = (pu->super_PlanningUnitMADPDiscrete)._m_madp;
        uVar6 = (**(code **)((long)*pMVar5 + 0xc0))(pMVar5,agI);
        oI = (Index)uVar7;
        if (uVar6 <= uVar7) break;
        aohI_00 = PlanningUnitMADPDiscrete::GetSuccessorAOHI
                            (&pu->super_PlanningUnitMADPDiscrete,agI,aohI,aI,oI);
        ohI_00 = PlanningUnitMADPDiscrete::GetSuccessorOHI
                           (&pu->super_PlanningUnitMADPDiscrete,agI,ohI,oI);
        tcI = BayesianGameWithClusterInfo::FindTypeClusterIndex(this_00,agI,tc,aI,oI);
        aI_00 = (**(code **)((long)(local_38->super_JointPolicyDiscrete).super_JointPolicy.
                                   _vptr_JointPolicy + 0x98))(local_38,agI,tcI);
        tc_00 = BayesianGameWithClusterInfo::GetTypeCluster(this_00,agI,tcI);
        (*(jpolJPPV->px->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
          _vptr_JointPolicy[0x10])(jpolJPPV->px,(ulong)agI,(ulong)ohI_00,(ulong)aI_00);
        if (ts + 1 <= (int)(pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon - 1U)
        {
          psVar4 = (jpolJPPV->pn).pi_;
          local_58.px = jpolJPPV->px;
          local_58.pn.pi_ = (jpolJPPV->pn).pi_;
          if (psVar4 != (sp_counted_base *)0x0) {
            LOCK();
            piVar1 = &psVar4->use_count_;
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          RecursivelyFillPolicyForAgent
                    (local_40,pu,&local_58,agI,ts + 1,aohI_00,ohI_00,tc_00,in_stack_ffffffffffffff58
                     ,aI_00,jpolBGVec,bgVec);
          boost::detail::shared_count::~shared_count(&local_58.pn);
        }
        uVar7 = (ulong)(oI + 1);
      }
      boost::detail::shared_count::~shared_count(&sStack_60);
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void
JointPolicyPureVectorForClusteredBG::RecursivelyFillPolicyForAgent(
            const PlanningUnitDecPOMDPDiscrete* pu,
            JPPV_sharedPtr jpolJPPV,
            Index agI,
            Index ts,
            Index aohI,
            Index ohI,
            const TypeCluster* tc,
            Index tI,
            Index aI,
            const std::vector<const JointPolicyDiscretePure* >& jpolBGVec,
            const std::vector<boost::shared_ptr<const BayesianGameWithClusterInfo> >& bgVec
    )const 
{    
    //const JointPolicyPureVectorForClusteredBG* jpolBG = jpolBGVec.at(ts);
    const JointPolicyDiscretePure *  jpolBG = jpolBGVec.at(ts);
    boost::shared_ptr<const BayesianGameWithClusterInfo> bg = bgVec.at(ts);

#if DEBUG_TOJPPV
    cout << ">>>Starting RecursivelyFillPolicyForAgent for " << endl;
    cout << "agI="<<agI<<endl;
    cout << "ts="<<ts<<endl;
    cout << "aohI="<<aohI<<endl;
    cout << "ohI="<<ohI<<endl;
    cout << "tI="<<tI<<endl;
    cout << "aI="<<aI<<endl;
    cout << "BG: " << endl << bg->SoftPrint();
    cout << endl;
#endif
    Index obsI = 0;
    for(obsI=0; obsI < pu->GetNrObservations(agI); obsI++)
    {
        Index n_aohI = pu->GetSuccessorAOHI(agI, aohI, aI, obsI);
        Index n_ohI = pu->GetSuccessorOHI(agI, ohI, obsI);
        ///NOTE: this can throw an error if there is no type 
        //for the history (e.g. if the histories prob. is 0)
        Index n_tI = 0;
        Index n_aI = 0; // ensure that action 0 is selected if exception is thrown
        try{
            n_tI = bg->FindTypeClusterIndex(agI, tc, aI, obsI);
            n_aI = jpolBG->GetActionIndex(agI, n_tI);
        } catch (E& e) {
            cout << "JointPolicyPureVectorForClusteredBG::RecursivelyFillPolicyForAgent implement catch?\n";
            continue;
        }

        const TypeCluster* n_tc =  bg->GetTypeCluster(agI, n_tI);
        
        jpolJPPV->SetAction(agI, n_ohI, n_aI); //<- here something happens

        Index h = pu->GetHorizon();
        Index n_ts = ts+1;
        if(n_ts  <= h - 1) // ts + 1 <= h - 1
        {
            RecursivelyFillPolicyForAgent(
                pu, jpolJPPV, agI, n_ts, n_aohI, n_ohI, 
                n_tc, n_tI, n_aI, jpolBGVec, bgVec);
        }
        else
        {
#if DEBUG_TOJPPV
            cout << "this is last stage, no further RecursivelyFillPolicyForAgent"<<endl;
#endif
        }
    }
}